

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::outhullfaces(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  tetgenbehavior *ptVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  bool bVar5;
  size_t sVar6;
  tetrahedron *pppdVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  FILE *local_448;
  int *local_440;
  char facefilename [1024];
  
  ptVar2 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(facefilename,ptVar2->outfilename);
    sVar6 = strlen(facefilename);
    builtin_strncpy(facefilename + sVar6,".face",6);
    if (ptVar2->quiet == 0) {
      printf("Writing %s.\n",facefilename);
    }
    local_448 = fopen(facefilename,"w");
    if (local_448 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",facefilename);
      terminatetetgen(this,1);
    }
    local_440 = (int *)0x0;
    fprintf(local_448,"%ld  0\n",this->hullsize);
  }
  else {
    if (ptVar2->quiet == 0) {
      puts("Writing faces.");
    }
    lVar9 = this->hullsize;
    local_448 = (FILE *)0x0;
    local_440 = (int *)operator_new__(-(ulong)((ulong)(lVar9 * 3) >> 0x3e != 0) | lVar9 * 0xc);
    out->trifacelist = local_440;
    out->numberoftrifaces = (int)lVar9;
  }
  uVar1 = this->in->firstnumber;
  uVar10 = 0;
  if (this->b->zeroindex == 0) {
    uVar10 = uVar1;
  }
  bVar5 = uVar10 == 0;
  memorypool::traversalinit(this->tetrahedrons);
  pppdVar7 = alltetrahedrontraverse(this);
  iVar12 = 0;
  while (pppdVar7 != (tetrahedron *)0x0) {
    if (pppdVar7[7] == (tetrahedron)this->dummypoint) {
      ppdVar3 = pppdVar7[5];
      lVar9 = (long)this->pointmarkindex;
      uVar11 = (uint)(uVar1 == 1 && bVar5);
      uVar8 = *(int *)((long)pppdVar7[4] + lVar9 * 4) - uVar11;
      ppdVar4 = pppdVar7[6];
      if (out == (tetgenio *)0x0) {
        fprintf(local_448,"%5d   %4d  %4d  %4d",(ulong)uVar10,(ulong)uVar8,
                (ulong)(*(int *)((long)ppdVar3 + lVar9 * 4) - uVar11),
                (ulong)(*(int *)((long)ppdVar4 + lVar9 * 4) - uVar11));
        fputc(10,local_448);
      }
      else {
        local_440[iVar12] = uVar8;
        local_440[(long)iVar12 + 1] = *(int *)((long)ppdVar3 + lVar9 * 4) - uVar11;
        local_440[(long)iVar12 + 2] = *(int *)((long)ppdVar4 + lVar9 * 4) - uVar11;
        iVar12 = iVar12 + 3;
      }
      uVar10 = uVar10 + 1;
    }
    pppdVar7 = alltetrahedrontraverse(this);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_448,"# Generated by %s\n",this->b->commandline);
    fclose(local_448);
  }
  return;
}

Assistant:

void tetgenmesh::outhullfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface hulltet;
  point torg, tdest, tapex;
  int *elist = NULL;
  int firstindex, shift;
  int facenumber;
  int index;

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  0\n", hullsize);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[hullsize * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    out->numberoftrifaces = hullsize;
    elist = out->trifacelist;
    index = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  hulltet.tet = alltetrahedrontraverse();
  facenumber = firstindex;
  while (hulltet.tet != (tetrahedron *) NULL) {
    if (ishulltet(hulltet)) {
      torg = (point) hulltet.tet[4];
      tdest = (point) hulltet.tet[5];
      tapex = (point) hulltet.tet[6];
      if (out == (tetgenio *) NULL) {
        // Face number, indices of three vertices.
        fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                pointmark(torg) - shift, pointmark(tdest) - shift,
                pointmark(tapex) - shift);
        fprintf(outfile, "\n");
      } else {
        // Output indices of three vertices.
        elist[index++] = pointmark(torg) - shift;
        elist[index++] = pointmark(tdest) - shift;
        elist[index++] = pointmark(tapex) - shift;
      }
      facenumber++;
    }
    hulltet.tet = alltetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}